

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

double __thiscall amrex::BoxArray::d_numPts(BoxArray *this)

{
  long *plVar1;
  BATType BVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  IndexType IVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int dir_1;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int dir;
  long lVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  IntVect IVar19;
  Box result;
  Box bx;
  ulong local_40;
  int local_38;
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar9 = ((long)*(pointer *)
                  ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) -
          *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data) / 0x1c;
  BVar2 = (this->m_bat).m_bat_type;
  iVar16 = (int)uVar9;
  if (BVar2 == bndryReg) {
    uVar13 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar16 < 1) {
      uVar9 = uVar13;
    }
    dVar17 = 0.0;
    for (; uVar9 * 0x1c - uVar13 != 0; uVar13 = uVar13 + 0x1c) {
      BATbndryReg::operator()
                (&bx,&(this->m_bat).m_op.m_bndryReg,
                 (Box *)(*(long *)&(peVar3->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + uVar13));
      dVar18 = Box::d_numPts(&bx);
      dVar17 = dVar17 + dVar18;
    }
  }
  else if (BVar2 == null) {
    uVar13 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar16 < 1) {
      uVar9 = uVar13;
    }
    dVar17 = 0.0;
    for (; uVar9 * 0x1c - uVar13 != 0; uVar13 = uVar13 + 0x1c) {
      dVar18 = Box::d_numPts((Box *)(*(long *)&(peVar3->m_abox).
                                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                               .
                                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                               ._M_impl.super__Vector_impl_data + uVar13));
      dVar17 = dVar17 + dVar18;
    }
  }
  else {
    IVar6 = BATransformer::index_type(&this->m_bat);
    IVar19 = BATransformer::coarsen_ratio(&this->m_bat);
    iVar12 = IVar19.vect[2];
    local_40 = IVar19.vect._0_8_;
    iVar15 = IVar19.vect[0];
    uVar13 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar16 < 1) {
      uVar9 = uVar13;
    }
    local_38 = iVar12;
    dVar17 = 0.0;
    for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      lVar11 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data;
      plVar1 = (long *)(lVar11 + uVar13 * 0x1c);
      lVar14 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar11 + 0xc + uVar13 * 0x1c);
      lVar11 = *plVar1;
      lVar5 = plVar1[1];
      result.bigend.vect[1] = (int)((ulong)lVar11 >> 0x20);
      result.bigend.vect[2] = (int)lVar5;
      result.btype.itype = (int)((ulong)lVar5 >> 0x20);
      result.smallend.vect[2] = (int)lVar4;
      result.bigend.vect[0] = (int)((ulong)lVar4 >> 0x20);
      iVar16 = IVar19.vect[1];
      result.smallend.vect[1] = (int)((ulong)lVar14 >> 0x20);
      uVar8 = result.smallend.vect[1];
      if (IVar19.vect._0_8_ >> 0x20 == 1 && iVar15 == 1) {
        result.smallend.vect._0_8_ = lVar14;
        if (iVar12 != 1) goto LAB_0050eb64;
      }
      else {
        result.smallend.vect[0] = (int)lVar14;
        if (iVar15 != 1) {
          if (iVar15 == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (iVar15 == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar15);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / iVar15;
          }
        }
        if (iVar16 != 1) {
          if (iVar16 == 4) {
            if (lVar14 < 0) {
              uVar8 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar8 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (iVar16 == 2) {
            if (lVar14 < 0) {
              uVar8 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar8 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if (lVar14 < 0) {
            uVar8 = ~(~result.smallend.vect[1] / iVar16);
          }
          else {
            uVar8 = result.smallend.vect[1] / iVar16;
          }
        }
LAB_0050eb64:
        result.smallend.vect[1] = uVar8;
        if (iVar12 != 1) {
          if (iVar12 == 4) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
            }
          }
          else if (iVar12 == 2) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
            }
          }
          else if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar12);
          }
          else {
            result.smallend.vect[2] = result.smallend.vect[2] / iVar12;
          }
        }
        result.btype.itype = (uint)((ulong)lVar5 >> 0x20);
        result.bigend.vect[2] = (int)lVar5;
        if (result.btype.itype == 0) {
          uVar8 = result.bigend.vect[0];
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              uVar8 = result.bigend.vect[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar15 == 2) {
              uVar8 = result.bigend.vect[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~(~result.bigend.vect[0] / iVar15);
            }
            else {
              uVar8 = result.bigend.vect[0] / iVar15;
            }
          }
          result.bigend.vect[0] = uVar8;
          uVar8 = result.bigend.vect[1];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar8 = result.bigend.vect[1] >> 2;
              if (-1 < lVar11) {
                uVar8 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar8 = result.bigend.vect[1] >> 1;
              if (-1 < lVar11) {
                uVar8 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar11 < 0) {
              uVar8 = ~(~result.bigend.vect[1] / iVar16);
            }
            else {
              uVar8 = result.bigend.vect[1] / iVar16;
            }
          }
          result.bigend.vect[1] = uVar8;
          uVar8 = result.bigend.vect[2];
          if (iVar12 != 1) {
            if (iVar12 == 4) {
              uVar8 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar8 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar12 == 2) {
              uVar8 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar8 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar8 = ~(~result.bigend.vect[2] / iVar12);
            }
            else {
              uVar8 = result.bigend.vect[2] / iVar12;
            }
          }
        }
        else {
          bx.smallend.vect[0] = 0;
          bx.smallend.vect[1] = 0;
          bx.smallend.vect[2] = 0;
          for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
            if (((result.btype.itype >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar14] % *(int *)((long)&local_40 + lVar14 * 4) != 0)) {
              bx.smallend.vect[lVar14] = 1;
            }
          }
          uVar8 = result.bigend.vect[0];
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              uVar8 = result.bigend.vect[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar15 == 2) {
              uVar8 = result.bigend.vect[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~(~result.bigend.vect[0] / iVar15);
            }
            else {
              uVar8 = result.bigend.vect[0] / iVar15;
            }
          }
          uVar10 = result.bigend.vect[1];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar10 = result.bigend.vect[1] >> 2;
              if (-1 < lVar11) {
                uVar10 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar10 = result.bigend.vect[1] >> 1;
              if (-1 < lVar11) {
                uVar10 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar11 < 0) {
              uVar10 = ~(~result.bigend.vect[1] / iVar16);
            }
            else {
              uVar10 = result.bigend.vect[1] / iVar16;
            }
          }
          uVar7 = result.bigend.vect[2];
          if (iVar12 != 1) {
            if (iVar12 == 4) {
              uVar7 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar7 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar12 == 2) {
              uVar7 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar7 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar7 = ~(~result.bigend.vect[2] / iVar12);
            }
            else {
              uVar7 = result.bigend.vect[2] / iVar12;
            }
          }
          result.bigend.vect[0] = uVar8 + bx.smallend.vect[0];
          result.bigend.vect[1] = uVar10 + bx.smallend.vect[1];
          uVar8 = uVar7 + bx.smallend.vect[2];
        }
        result.bigend.vect[2] = uVar8;
      }
      bx.bigend.vect[1] = result.bigend.vect[1];
      bx.bigend.vect[2] = result.bigend.vect[2];
      bx.btype = result.btype;
      bx.smallend.vect[0] = result.smallend.vect[0];
      bx.smallend.vect[1] = result.smallend.vect[1];
      bx.smallend.vect[2] = result.smallend.vect[2];
      bx.bigend.vect[0] = result.bigend.vect[0];
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        uVar8 = 1 << ((byte)lVar11 & 0x1f);
        uVar10 = (uint)lVar11;
        bx.bigend.vect[lVar11] =
             (bx.bigend.vect[lVar11] + (uint)((IVar6.itype >> (uVar10 & 0x1f) & 1) != 0)) -
             (uint)((bx.btype.itype >> (uVar10 & 0x1f) & 1) != 0);
        if ((IVar6.itype >> (uVar10 & 0x1f) & 1) == 0) {
          bx.btype.itype = ~uVar8 & bx.btype.itype;
        }
        else {
          bx.btype.itype = uVar8 | bx.btype.itype;
        }
      }
      dVar18 = Box::d_numPts(&bx);
      dVar17 = dVar17 + dVar18;
    }
  }
  return dVar17;
}

Assistant:

double
BoxArray::d_numPts () const noexcept
{
    double result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].d_numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).d_numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).d_numPts();
        }
    }

    return result;
}